

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::RunCrossover(LpSolver *this)

{
  Vector *x;
  Vector *y;
  Vector *z;
  Model *model;
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  pointer piVar6;
  ostream *poVar7;
  double *pdVar8;
  ipx *piVar9;
  string *__return_storage_ptr__;
  ulong uVar10;
  double dVar11;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  Crossover crossover;
  
  piVar6 = (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar6) {
    (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar6;
  }
  pdVar8 = (double *)(this->crossover_weights_)._M_size;
  if (pdVar8 != (double *)0x0) {
    pdVar8 = (this->crossover_weights_)._M_data;
  }
  iVar3 = (this->model_).num_rows_;
  iVar4 = (this->model_).num_cols_;
  Crossover::Crossover(&crossover,&this->control_);
  x = &this->x_crossover_;
  y = &this->y_crossover_;
  z = &this->z_crossover_;
  Crossover::PushAll(&crossover,
                     (this->basis_)._M_t.
                     super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
                     super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                     super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl,x,y,z,pdVar8,
                     &this->info_);
  (this->info_).super_ipx_info.time_crossover = crossover.time_primal_ + crossover.time_dual_;
  (this->info_).super_ipx_info.updates_crossover = crossover.dual_pivots_ + crossover.primal_pivots_
  ;
  if ((this->info_).super_ipx_info.status_crossover == 1) {
    model = &this->model_;
    this_00 = &this->basic_statuses_;
    Basis::ComputeBasicSolution
              ((this->basis_)._M_t.
               super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
               super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
               super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl,x,y,z);
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)iVar4 + (long)iVar3);
    piVar6 = (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar10 = 0;
        uVar10 < (ulong)((long)(this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
        uVar10 = uVar10 + 1) {
      bVar5 = Basis::IsBasic((this->basis_)._M_t.
                             super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                             super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl,(Int)uVar10);
      if (bVar5) {
        piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6[uVar10] = 0;
      }
      else {
        dVar11 = (this->model_).lb_._M_data[uVar10];
        dVar1 = (this->model_).ub_._M_data[uVar10];
        if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) {
          dVar2 = (this->x_crossover_)._M_data[uVar10];
          if ((dVar2 != dVar11) || (NAN(dVar2) || NAN(dVar11))) {
            piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
              piVar6[uVar10] = -3;
            }
            else {
              piVar6[uVar10] = -2;
            }
          }
          else {
            piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6[uVar10] = -1;
          }
        }
        else {
          piVar6 = (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6[uVar10] = 0.0 <= (this->z_crossover_)._M_data[uVar10] | 0xfffffffe;
        }
      }
    }
    poVar7 = Control::Debug(&this->control_,1);
    Textline<char[35]>(&local_b8,(char (*) [35])"Bound violation of basic solution:");
    poVar7 = std::operator<<(poVar7,(string *)&local_b8);
    piVar9 = (ipx *)x;
    dVar11 = PrimalInfeasibility(model,x);
    sci2_abi_cxx11_(&local_d8,piVar9,dVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_d8);
    poVar7 = std::operator<<(poVar7,'\n');
    Textline<char[39]>(&local_78,(char (*) [39])"Dual sign violation of basic solution:");
    poVar7 = std::operator<<(poVar7,(string *)&local_78);
    piVar9 = (ipx *)x;
    dVar11 = DualInfeasibility(model,x,z);
    sci2_abi_cxx11_(&local_98,piVar9,dVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_98);
    std::operator<<(poVar7,'\n');
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    poVar7 = Control::Debug(&this->control_,1);
    __return_storage_ptr__ = &local_b8;
    Textline<char[40]>(__return_storage_ptr__,
                       (char (*) [40])"Minimum singular value of basis matrix:");
    poVar7 = std::operator<<(poVar7,(string *)__return_storage_ptr__);
    dVar11 = Basis::MinSingularValue
                       ((this->basis_)._M_t.
                        super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
                        super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
                        super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl);
    sci2_abi_cxx11_(&local_d8,(ipx *)__return_storage_ptr__,dVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_d8);
    std::operator<<(poVar7,'\n');
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    Model::EvaluateBasicSolution(model,x,y,z,this_00,&this->info_);
    dVar11 = (this->info_).super_ipx_info.primal_infeas;
    pdVar8 = &(this->control_).parameters_.super_ipx_parameters.pfeasibility_tol;
    if ((*pdVar8 <= dVar11 && dVar11 != *pdVar8) ||
       (dVar11 = (this->info_).super_ipx_info.dual_infeas,
       pdVar8 = &(this->control_).parameters_.super_ipx_parameters.dfeasibility_tol,
       *pdVar8 <= dVar11 && dVar11 != *pdVar8)) {
      (this->info_).super_ipx_info.status_crossover = 2;
    }
  }
  else {
    std::valarray<double>::resize(x,0,0.0);
    std::valarray<double>::resize(y,0,0.0);
    std::valarray<double>::resize(z,0,0.0);
  }
  return;
}

Assistant:

void LpSolver::RunCrossover() {
    assert(basis_);
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const double *weights = NULL;
    basic_statuses_.clear();

    if (crossover_weights_.size()) {
        assert((Int)crossover_weights_.size() == n+m);
        weights = &crossover_weights_[0];
    }

    Crossover crossover(control_);
    crossover.PushAll(basis_.get(), x_crossover_, y_crossover_, z_crossover_,
                      weights, &info_);
    info_.time_crossover =
        crossover.time_primal() + crossover.time_dual();
    info_.updates_crossover =
        crossover.primal_pivots() + crossover.dual_pivots();
    if (info_.status_crossover != IPX_STATUS_optimal) {
        // Crossover failed. Discard solution.
        x_crossover_.resize(0);
        y_crossover_.resize(0);
        z_crossover_.resize(0);
        return;
    }

    // Recompute vertex solution and set basic statuses.
    basis_->ComputeBasicSolution(x_crossover_, y_crossover_, z_crossover_);
    basic_statuses_.resize(n+m);
    for (size_t j = 0; j < basic_statuses_.size(); j++) {
        if (basis_->IsBasic(j)) {
            basic_statuses_[j] = IPX_basic;
        } else {
            if (lb[j] == ub[j])
                basic_statuses_[j] = z_crossover_[j] >= 0.0 ?
                    IPX_nonbasic_lb : IPX_nonbasic_ub;
            else if (x_crossover_[j] == lb[j])
                basic_statuses_[j] = IPX_nonbasic_lb;
            else if (x_crossover_[j] == ub[j])
                basic_statuses_[j] = IPX_nonbasic_ub;
            else
                basic_statuses_[j] = IPX_superbasic;
        }
    }
    control_.Debug()
        << Textline("Bound violation of basic solution:")
        << sci2(PrimalInfeasibility(model_, x_crossover_)) << '\n'
        << Textline("Dual sign violation of basic solution:")
        << sci2(DualInfeasibility(model_, x_crossover_, z_crossover_)) << '\n';
    control_.Debug()
        << Textline("Minimum singular value of basis matrix:")
        << sci2(basis_->MinSingularValue()) << '\n';

    // Declare crossover status "imprecise" if the vertex solution defined by
    // the final basis does not satisfy tolerances.
    model_.EvaluateBasicSolution(x_crossover_, y_crossover_, z_crossover_,
                                 basic_statuses_, &info_);
    if (info_.primal_infeas > control_.pfeasibility_tol() ||
        info_.dual_infeas > control_.dfeasibility_tol())
        info_.status_crossover = IPX_STATUS_imprecise;
}